

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

json_t * json_load_callback(json_load_callback_t callback,void *arg,size_t flags,json_error_t *error
                           )

{
  int iVar1;
  undefined1 local_4d0 [8];
  callback_data_t stream_data;
  json_t *result;
  lex_t lex;
  json_error_t *error_local;
  size_t flags_local;
  void *arg_local;
  json_load_callback_t callback_local;
  
  lex.value.string.len = (size_t)error;
  memset(local_4d0,0,0x420);
  stream_data.pos = (size_t)callback;
  stream_data.callback = (json_load_callback_t)arg;
  jsonp_error_init((json_error_t *)lex.value.string.len,"<callback>");
  if (callback == (json_load_callback_t)0x0) {
    error_set((json_error_t *)lex.value.string.len,(lex_t *)0x0,json_error_invalid_argument,
              "wrong arguments");
    callback_local = (json_load_callback_t)0x0;
  }
  else {
    iVar1 = lex_init((lex_t *)&result,callback_get,flags,local_4d0);
    if (iVar1 == 0) {
      stream_data.arg = parse_json((lex_t *)&result,flags,(json_error_t *)lex.value.string.len);
      lex_close((lex_t *)&result);
      callback_local = (json_load_callback_t)stream_data.arg;
    }
    else {
      callback_local = (json_load_callback_t)0x0;
    }
  }
  return (json_t *)callback_local;
}

Assistant:

json_t *json_load_callback(json_load_callback_t callback, void *arg, size_t flags,
                           json_error_t *error) {
    lex_t lex;
    json_t *result;

    callback_data_t stream_data;

    memset(&stream_data, 0, sizeof(stream_data));
    stream_data.callback = callback;
    stream_data.arg = arg;

    jsonp_error_init(error, "<callback>");

    if (callback == NULL) {
        error_set(error, NULL, json_error_invalid_argument, "wrong arguments");
        return NULL;
    }

    if (lex_init(&lex, (get_func) callback_get, flags, &stream_data))
        return NULL;

    result = parse_json(&lex, flags, error);

    lex_close(&lex);
    return result;
}